

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# overlay.tpl.h
# Opt level: O1

void __thiscall
r_exec::Controller::__take_input<r_exec::PGMController>(Controller *this,View *input)

{
  atomic_int_fast64_t *paVar1;
  _ReductionJob *this_00;
  _Mem *this_01;
  
  this_00 = (_ReductionJob *)operator_new(0x28);
  _ReductionJob::_ReductionJob(this_00);
  (this_00->super__Object)._vptr__Object = (_func_int **)&PTR__ReductionJob_001c0ff8;
  this_00[1].super__Object._vptr__Object = (_func_int **)input;
  if (input != (View *)0x0) {
    LOCK();
    paVar1 = &(input->super_View).super__Object.refCount;
    (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + 1;
    UNLOCK();
  }
  this_00[1].super__Object.refCount.super___atomic_base<long>._M_i = (__int_type)this;
  LOCK();
  paVar1 = &(this->super__Object).refCount;
  (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + 1;
  UNLOCK();
  this_01 = (_Mem *)r_code::Mem::Get();
  _Mem::pushReductionJob(this_01,this_00);
  return;
}

Assistant:

void Controller::__take_input(r_exec::View *input)   // utility: to be called by sub-classes.
{
    ReductionJob<C> *j = new ReductionJob<C>(input/*_view*/, (C *)this);
    _Mem::Get()->pushReductionJob(j);
}